

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O2

RC __thiscall QO_Manager::CalculateOptJoin(QO_Manager *this,int relsInJoin,int relSize)

{
  _Rb_tree_header *p_Var1;
  uint newRel;
  uint *puVar2;
  uint relsInJoin_00;
  RC RVar3;
  uint *puVar4;
  int indexCond;
  int indexAttr;
  float totalTuples;
  float cost;
  QO_Manager *local_80;
  vector<int,_std::allocator<int>_> relsInJoinVec;
  map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_> attrStats;
  
  relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_80 = this;
  ConvertBitmapToVec(this,relsInJoin,&relsInJoinVec);
  puVar2 = (uint *)operator_new(0x48);
  puVar2[0] = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  *(uint **)(puVar2 + 0xc) = puVar2 + 8;
  *(uint **)(puVar2 + 0xe) = puVar2 + 8;
  puVar2[0x10] = 0;
  puVar2[0x11] = 0;
  puVar2[3] = 0x7f7fffff;
  puVar2[4] = 0xffffffff;
  puVar2[5] = 0xffffffff;
  p_Var1 = &attrStats._M_t._M_impl.super__Rb_tree_header;
  puVar4 = (uint *)relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  do {
    if (puVar4 == (uint *)relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish) {
      attrStats._M_t._M_impl._0_4_ = relsInJoin;
      attrStats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar2;
      std::
      _Rb_tree<int,std::pair<int_const,costElem*>,std::_Select1st<std::pair<int_const,costElem*>>,std::less<int>,std::allocator<std::pair<int_const,costElem*>>>
      ::_M_insert_unique<std::pair<int_const,costElem*>>
                ((_Rb_tree<int,std::pair<int_const,costElem*>,std::_Select1st<std::pair<int_const,costElem*>>,std::less<int>,std::allocator<std::pair<int_const,costElem*>>>
                  *)((local_80->optcost).
                     super__Vector_base<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>,_std::allocator<std::map<int,_costElem_*,_std::less<int>,_std::allocator<std::pair<const_int,_costElem_*>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + relSize),
                 (pair<const_int,_costElem_*> *)&attrStats);
      RVar3 = 0;
LAB_00112253:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&relsInJoinVec.super__Vector_base<int,_std::allocator<int>_>);
      return RVar3;
    }
    newRel = *puVar4;
    if (0x20 < newRel) {
      RVar3 = 0x19b;
      goto LAB_00112253;
    }
    attrStats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         attrStats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    attrStats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    attrStats._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    indexAttr = -1;
    relsInJoin_00 = relsInJoin & ~(1 << (newRel & 0x1f));
    indexCond = -1;
    attrStats._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    attrStats._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    CalculateJoin(local_80,relsInJoin_00,newRel,relSize,&cost,&totalTuples,
                  (map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                   *)&attrStats._M_t,&indexAttr,&indexCond);
    if (cost < (float)puVar2[3]) {
      puVar2[3] = (uint)cost;
      std::
      _Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
      ::clear((_Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               *)(puVar2 + 6));
      std::
      _Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
      ::operator=((_Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
                   *)(puVar2 + 6),&attrStats._M_t);
      *puVar2 = relsInJoin_00;
      puVar2[1] = *puVar4;
      puVar2[2] = (uint)totalTuples;
      puVar2[4] = indexAttr;
      puVar2[5] = indexCond;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_attrStat>,_std::_Select1st<std::pair<const_int,_attrStat>_>,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
    ::~_Rb_tree(&attrStats._M_t);
    puVar4 = puVar4 + 1;
  } while( true );
}

Assistant:

RC QO_Manager::CalculateOptJoin(int relsInJoin, int relSize){
  RC rc = 0;
  // create a vector of these relations in the bitmap
  vector<int> relsInJoinVec;
  ConvertBitmapToVec(relsInJoin, relsInJoinVec);

  // Create a cost element, and initialize its values
  vector<int>::iterator it;
  costElem *costTable = new costElem();
  costTable->cost = FLT_MAX;
  costTable->indexAttr = -1;
  costTable->indexCond = -1;
  // iterate through all ways of removing a relation a
  for(it = relsInJoinVec.begin(); it != relsInJoinVec.end(); ++it){
    int subJoin = relsInJoin;
    if((rc = RemoveRelFromBitmap(*it, subJoin)))
      return (rc);

    float cost;
    map<int, attrStat> attrStats;
    float totalTuples;
    int indexAttr = -1;
    int indexCond = -1;
    // Calculate the a join (S-a)
    if((rc = CalculateJoin(subJoin, *it, relSize, cost, totalTuples, attrStats, indexAttr, indexCond)))
      return (rc);
    // if the cost is the smallest so far, update all values
    if(cost < costTable->cost){ 
      costTable->cost = cost;
      costTable->attrs.clear();
      costTable->attrs = attrStats;
      costTable->joins = subJoin;
      costTable->newRelIndex = *it;
      costTable->numTuples = totalTuples;
      costTable->indexAttr = indexAttr;
      costTable->indexCond = indexCond;
    }
  }
  // insert the costElem as the optimal way of arriving
  // at this join
  optcost[relSize].insert({relsInJoin, costTable});

  return (0);
}